

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall
lest::unexpected::unexpected(unexpected *this,location *where_,text *expr_,text *note_)

{
  allocator local_a9;
  text local_a8;
  text local_88;
  text local_68;
  location local_48;
  
  std::__cxx11::string::string((string *)&local_68,"failed: got unexpected exception",&local_a9);
  location::location(&local_48,where_);
  std::__cxx11::string::string((string *)&local_88,(string *)expr_);
  std::__cxx11::string::string((string *)&local_a8,(string *)note_);
  message::message(&this->super_message,&local_68,&local_48,&local_88,&local_a8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  *(undefined ***)&this->super_message = &PTR__message_0010ed90;
  return;
}

Assistant:

unexpected( location where_, text expr_, text note_ = "" )
    : message( "failed: got unexpected exception", where_, expr_, note_) {}